

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::truncated_normal_dist<float>::cdf(truncated_normal_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float fVar1;
  
  param_type::mu(in_RDI);
  param_type::sigma(in_RDI);
  fVar1 = math::Phi(4.533603e-39);
  return (fVar1 - in_RDI->Phi_a) / (in_RDI->Phi_b - in_RDI->Phi_a);
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return (math::Phi(x) - P.Phi_a) / (P.Phi_b - P.Phi_a);
    }